

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O1

newtRef NewtExpandPath(char *s)

{
  char *s1;
  newtRef nVar1;
  char *__ptr;
  char *subdir;
  char *local_20;
  
  local_20 = (char *)0x0;
  s1 = s;
  if (*s != '/') {
    if (*s == '~') {
      s1 = NewtGetHomeDir(s,&local_20);
      if ((local_20 == (char *)0x0) || (local_20[1] == '\0')) {
        local_20 = (char *)0x0;
      }
      else {
        local_20 = local_20 + 1;
      }
    }
    else {
      s1 = (char *)0x0;
      local_20 = s;
    }
  }
  if (s1 == (char *)0x0) {
    s1 = getcwd((char *)0x0,0);
    __ptr = s1;
  }
  else {
    __ptr = (char *)0x0;
  }
  if (local_20 != (char *)0x0) {
    s1 = NewtJoinPath(s1,local_20,'/');
    NewtRelToAbsPath(s1);
  }
  nVar1 = NewtMakeString(s1,false);
  if (local_20 != (char *)0x0) {
    free(s1);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return nVar1;
}

Assistant:

newtRef NewtExpandPath(const char *	s)
{
    newtRefVar	r = kNewtRefUnbind;
    char *  subdir = NULL;
    char *  dir = NULL;
    char *  wd = NULL;
    char	sep;
    
    sep = NewtGetFileSeparator();
    
    if (*s == sep)
    {
        dir = (char *)s;
    }
#ifdef WIN32
    else if (isalpha(*s) && s[1] == ':')
    {
        dir = (char *)s;
    }
#endif
    else if (*s == '~')
    {
        dir = NewtGetHomeDir(s, &subdir);
        
        if (subdir != NULL && subdir[1])
            subdir++;
        else
            subdir = NULL;
    }
    else
    {
        subdir = (char *)s;
    }